

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  bool bVar1;
  int local_fc;
  string local_f8;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  DeathTestImpl *local_10;
  DeathTestImpl *this_local;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_001d22d0;
  local_10 = this;
  do {
    bVar1 = IsTrue(this->read_fd_ == -1);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,"CHECK failed: File ",&local_d1);
      std::operator+(&local_b0,&local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]spoa/build_O0/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_90,&local_b0,", line ");
      local_fc = 0x199;
      StreamableToString<int>(&local_f8,&local_fc);
      std::operator+(&local_70,&local_90,&local_f8);
      std::operator+(&local_50,&local_70,": ");
      std::operator+(&local_30,&local_50,"read_fd_ == -1");
      DeathTestAbort(&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&this->matcher_);
  DeathTest::~DeathTest(&this->super_DeathTest);
  return;
}

Assistant:

~DeathTestImpl() override { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }